

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O3

void __thiscall QFbScreen::addWindow(QFbScreen *this,QFbWindow *window)

{
  QFbBackingStore *pQVar1;
  long lVar2;
  long lVar3;
  QWindow *pQVar4;
  ulong i;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = window;
  QtPrivate::QPodArrayOps<QFbWindow*>::emplace<QFbWindow*&>
            ((QPodArrayOps<QFbWindow*> *)(this + 0x20),0,(QFbWindow **)local_48);
  if (*(long *)(this + 0xa8) != 0) {
    i = 0;
    do {
      pQVar1 = *(QFbBackingStore **)(*(long *)(this + 0xa0) + i * 8);
      lVar2 = QPlatformBackingStore::window();
      lVar3 = QPlatformWindow::window();
      if (lVar2 == lVar3) {
        window->mBackingStore = pQVar1;
        QList<QFbBackingStore_*>::removeAt((QList<QFbBackingStore_*> *)(this + 0x98),i);
        break;
      }
      i = i + 1;
    } while (i < *(ulong *)(this + 0xa8));
  }
  local_48 = (**(code **)(*(long *)window + 0x30))(window);
  (**(code **)(*(long *)this + 0xd0))(this);
  pQVar4 = topWindow(this);
  QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
            (pQVar4,7);
  (**(code **)(*(long *)this + 0xb8))(this,pQVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbScreen::addWindow(QFbWindow *window)
{
    mWindowStack.prepend(window);
    if (!mPendingBackingStores.isEmpty()) {
        //check if we have a backing store for this window
        for (int i = 0; i < mPendingBackingStores.size(); ++i) {
            QFbBackingStore *bs = mPendingBackingStores.at(i);
            // this gets called during QWindow::create() at a point where the
            // invariant (window->handle()->window() == window) is broken
            if (bs->window() == window->window()) {
                window->setBackingStore(bs);
                mPendingBackingStores.removeAt(i);
                break;
            }
        }
    }
    setDirty(window->geometry());
    QWindow *w = topWindow();
    QWindowSystemInterface::handleFocusWindowChanged(w);
    topWindowChanged(w);
}